

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

string * __thiscall
httplib::to_string_abi_cxx11_(string *__return_storage_ptr__,httplib *this,Error error)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_17;
  allocator<char> local_16;
  allocator<char> local_15;
  allocator<char> local_14;
  allocator<char> local_13;
  allocator<char> local_12;
  allocator<char> local_11;
  allocator<char> local_10;
  allocator<char> local_f;
  allocator<char> local_e;
  allocator<char> local_d;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  switch((ulong)this & 0xffffffff) {
  case 0:
    __s = "Success";
    __a = &local_9;
    break;
  case 1:
    __s = "Unknown";
    __a = &local_16;
    break;
  case 2:
    __s = "Connection";
    __a = &local_a;
    break;
  case 3:
    __s = "BindIPAddress";
    __a = &local_b;
    break;
  case 4:
    __s = "Read";
    __a = &local_c;
    break;
  case 5:
    __s = "Write";
    __a = &local_d;
    break;
  case 6:
    __s = "ExceedRedirectCount";
    __a = &local_e;
    break;
  case 7:
    __s = "Canceled";
    __a = &local_f;
    break;
  case 8:
    __s = "SSLConnection";
    __a = &local_10;
    break;
  case 9:
    __s = "SSLLoadingCerts";
    __a = &local_11;
    break;
  case 10:
    __s = "SSLServerVerification";
    __a = &local_12;
    break;
  case 0xb:
    __s = "UnsupportedMultipartBoundaryChars";
    __a = &local_13;
    break;
  case 0xc:
    __s = "Compression";
    __a = &local_14;
    break;
  case 0xd:
    __s = "ConnectionTimeout";
    __a = &local_15;
    break;
  default:
    __s = "Invalid";
    __a = &local_17;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

inline std::string to_string(const Error error) {
        switch (error) {
            case Error::Success: return "Success";
            case Error::Connection: return "Connection";
            case Error::BindIPAddress: return "BindIPAddress";
            case Error::Read: return "Read";
            case Error::Write: return "Write";
            case Error::ExceedRedirectCount: return "ExceedRedirectCount";
            case Error::Canceled: return "Canceled";
            case Error::SSLConnection: return "SSLConnection";
            case Error::SSLLoadingCerts: return "SSLLoadingCerts";
            case Error::SSLServerVerification: return "SSLServerVerification";
            case Error::UnsupportedMultipartBoundaryChars:
                return "UnsupportedMultipartBoundaryChars";
            case Error::Compression: return "Compression";
            case Error::ConnectionTimeout: return "ConnectionTimeout";
            case Error::Unknown: return "Unknown";
            default: break;
        }

        return "Invalid";
    }